

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

int IoTHubTransport_AMQP_Common_DeviceMethod_Response
              (IOTHUB_DEVICE_HANDLE handle,METHOD_HANDLE methodId,uchar *response,
              size_t response_size,int status_response)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  IOTHUBTRANSPORT_AMQP_METHOD_HANDLE saved_handle;
  AMQP_TRANSPORT_DEVICE_INSTANCE *device_state;
  int result;
  int status_response_local;
  size_t response_size_local;
  uchar *response_local;
  METHOD_HANDLE methodId_local;
  IOTHUB_DEVICE_HANDLE handle_local;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0) {
    device_state._0_4_ = 0x6ed;
  }
  else {
    iVar1 = iothubtransportamqp_methods_respond
                      ((IOTHUBTRANSPORT_AMQP_METHOD_HANDLE)methodId,response,response_size,
                       status_response);
    if (iVar1 == 0) {
      device_state._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                  ,"IoTHubTransport_AMQP_Common_DeviceMethod_Response",0x6e3,1,
                  "iothubtransportamqp_methods_respond failed");
      }
      device_state._0_4_ = 0x6e4;
    }
  }
  return (int)device_state;
}

Assistant:

int IoTHubTransport_AMQP_Common_DeviceMethod_Response(IOTHUB_DEVICE_HANDLE handle, METHOD_HANDLE methodId, const unsigned char* response, size_t response_size, int status_response)
{
    (void)response;
    (void)response_size;
    (void)status_response;
    (void)methodId;
    int result;
    AMQP_TRANSPORT_DEVICE_INSTANCE* device_state = (AMQP_TRANSPORT_DEVICE_INSTANCE*)handle;
    if (device_state != NULL)
    {
        IOTHUBTRANSPORT_AMQP_METHOD_HANDLE saved_handle = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE)methodId;
        if (iothubtransportamqp_methods_respond(saved_handle, response, response_size, status_response) != 0)
        {
            LogError("iothubtransportamqp_methods_respond failed");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    else
    {
        result = MU_FAILURE;
    }
    return result;
}